

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

real __thiscall fasttext::DenseMatrix::dotRow(DenseMatrix *this,Vector *vec,int64_t i)

{
  ulong uVar1;
  ulong uVar2;
  EncounteredNaNError *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x71,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((this->super_Matrix).m_ <= i) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x72,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  uVar1 = (this->super_Matrix).n_;
  if ((vec->data_).size_ != uVar1) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x73,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((long)uVar1 < 1) {
    fVar6 = 0.0;
  }
  else {
    uVar4 = i * uVar1;
    uVar2 = (this->data_).size_;
    uVar5 = 0;
    uVar3 = uVar2 - uVar4;
    if (uVar2 < uVar4) {
      uVar3 = uVar5;
    }
    auVar7 = ZEXT816(0);
    do {
      if (uVar3 <= uVar1 - 1) {
        __assert_fail("i * n_ + j < data_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.h"
                      ,0x31,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
      }
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)(this->data_).mem_[uVar4 + uVar5]),
                               ZEXT416((uint)(vec->data_).mem_[uVar5]));
      fVar6 = auVar7._0_4_;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (NAN(fVar6)) {
    this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
    EncounteredNaNError::EncounteredNaNError(this_00);
    __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
  }
  return fVar6;
}

Assistant:

real DenseMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw EncounteredNaNError();
  }
  return d;
}